

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Js::AsmJsFunctionCompilation::CleanUp(AsmJsFunctionCompilation *this)

{
  FunctionBody *this_00;
  FunctionBody *body;
  AsmJsFunctionCompilation *this_local;
  
  if ((this->mGenerator != (AsmJSByteCodeGenerator *)0x0) &&
     (this->mGenerator->mInfo != (FuncInfo *)0x0)) {
    this_00 = AsmJsFunc::GetFuncBody(this->mGenerator->mFunction);
    if (this_00 != (FunctionBody *)0x0) {
      FunctionBody::ResetByteCodeGenState(this_00);
    }
    ByteCodeWriter::Reset(&(this->mGenerator->mWriter).super_ByteCodeWriter);
  }
  return;
}

Assistant:

void AsmJsFunctionCompilation::CleanUp()
    {
        if( mGenerator && mGenerator->mInfo )
        {
            FunctionBody* body = mGenerator->mFunction->GetFuncBody();
            if( body )
            {
                body->ResetByteCodeGenState();
            }
            mGenerator->mWriter.Reset();
        }
    }